

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O1

tdir_t TIFFNumberOfDirectories(TIFF *tif)

{
  int iVar1;
  tdir_t tVar2;
  tdir_t nextdirnum;
  tdir_t local_2c;
  ulong local_28;
  
  if ((tif->tif_flags & 0x80000) == 0) {
    local_28 = (ulong)(tif->tif_header).classic.tiff_diroff;
  }
  else {
    local_28 = (tif->tif_header).big.tiff_diroff;
  }
  local_2c = 0;
  tVar2 = 0;
  if (local_28 != 0) {
    do {
      iVar1 = TIFFAdvanceDirectory(tif,&local_28,(uint64_t *)0x0,&local_2c);
      if (iVar1 == 0) {
        return tVar2;
      }
      tVar2 = tVar2 + 1;
    } while (local_28 != 0);
  }
  return tVar2;
}

Assistant:

tdir_t TIFFNumberOfDirectories(TIFF *tif)
{
    uint64_t nextdiroff;
    tdir_t nextdirnum;
    tdir_t n;
    if (!(tif->tif_flags & TIFF_BIGTIFF))
        nextdiroff = tif->tif_header.classic.tiff_diroff;
    else
        nextdiroff = tif->tif_header.big.tiff_diroff;
    nextdirnum = 0;
    n = 0;
    while (nextdiroff != 0 &&
           TIFFAdvanceDirectory(tif, &nextdiroff, NULL, &nextdirnum))
    {
        ++n;
    }
    return (n);
}